

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu_registers.h
# Opt level: O2

void __thiscall n_e_s::core::PpuVram::increase_y(PpuVram *this)

{
  byte bVar1;
  ushort uVar2;
  
  uVar2 = (this->super_Register<unsigned_short>).value_;
  bVar1 = (byte)(uVar2 >> 0xc) & 7;
  if (bVar1 == 7) {
    bVar1 = (byte)(uVar2 >> 5) & 0x1f;
    if (bVar1 == 0x1f) {
      uVar2 = uVar2 & 0x8c1f;
    }
    else if ((uVar2 >> 5 & 0x1f) == 0x1d) {
      uVar2 = uVar2 & 0x8c1f ^ 0x800;
    }
    else {
      uVar2 = (ushort)(byte)(bVar1 + 1) * 0x20 + (uVar2 & 0x8c1f);
    }
  }
  else {
    uVar2 = (ushort)(byte)(bVar1 + 1) << 0xc | uVar2 & 0x8fff;
  }
  (this->super_Register<unsigned_short>).value_ = uVar2;
  return;
}

Assistant:

[[nodiscard]] constexpr uint8_t fine_scroll_y() const {
        return static_cast<uint8_t>(value_ >> 12u) & 0b0000'0111u;
    }